

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

int IDAWFtolerances(void *ida_mem,IDAEwtFn efun)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar1 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x3e2;
  }
  else {
    if (*(int *)((long)ida_mem + 0x6a0) != 0) {
      *(undefined4 *)((long)ida_mem + 0x20) = 3;
      *(undefined4 *)((long)ida_mem + 0x44) = 1;
      *(IDAEwtFn *)((long)ida_mem + 0x48) = efun;
      *(undefined8 *)((long)ida_mem + 0x50) = 0;
      return 0;
    }
    msgfmt = "Attempt to call before IDAMalloc.";
    iVar1 = -0x17;
    error_code = -0x17;
    line = 0x3e9;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAWFtolerances",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int IDAWFtolerances(void* ida_mem, IDAEwtFn efun)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    return (IDA_NO_MALLOC);
  }

  IDA_mem->ida_itol = IDA_WF;

  IDA_mem->ida_user_efun = SUNTRUE;
  IDA_mem->ida_efun      = efun;
  IDA_mem->ida_edata     = NULL; /* will be set to user_data in InitialSetup */

  return (IDA_SUCCESS);
}